

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECatAccess.cpp
# Opt level: O0

long __thiscall bhf::ads::ECatAccess::ListECatMasters(ECatAccess *this,ostream *os)

{
  uint uVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  size_type sVar5;
  unsigned_short *buffer;
  reference pvVar6;
  string local_9c0 [4];
  uint32_t slaveCount;
  stringstream local_9a0 [8];
  stringstream stream_4;
  ostream local_990 [378];
  AmsNetId local_816;
  string local_810 [2];
  AmsNetId netId;
  stringstream local_7f0 [8];
  stringstream stream_3;
  ostream local_7e0 [376];
  char acStack_668 [8];
  char deviceName [255];
  stringstream local_548 [8];
  stringstream stream_2;
  ostream local_538 [382];
  ushort local_3ba;
  uint local_3b8;
  undefined4 uStack_3b4;
  uint16_t devType;
  uint32_t i;
  stringstream local_390 [8];
  stringstream stream_1;
  ostream local_380 [383];
  allocator<unsigned_short> local_201;
  undefined1 local_200 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> deviceIds;
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8 [376];
  ECatAccess *local_30;
  long status;
  uint32_t bytesRead;
  uint32_t numberOfDevices;
  ostream *os_local;
  ECatAccess *this_local;
  
  _bytesRead = os;
  os_local = (ostream *)this;
  local_30 = (ECatAccess *)
             AdsDevice::ReadReqEx2
                       (&this->device,0x5000,2,4,(void *)((long)&status + 4),(uint32_t *)&status);
  if (local_30 == (ECatAccess *)0x0) {
    this_local = local_30;
    if (status._4_4_ != 0) {
      uVar1 = status._4_4_ + 1;
      std::allocator<unsigned_short>::allocator(&local_201);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,(ulong)uVar1,
                 &local_201);
      std::allocator<unsigned_short>::~allocator(&local_201);
      sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::capacity
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200);
      buffer = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200);
      local_30 = (ECatAccess *)
                 AdsDevice::ReadReqEx2(&this->device,0x5000,1,sVar5 * 2,buffer,(uint32_t *)&status);
      if (local_30 == (ECatAccess *)0x0) {
        for (local_3b8 = 1; local_3b8 <= status._4_4_; local_3b8 = local_3b8 + 1) {
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,
                              (ulong)local_3b8);
          local_30 = (ECatAccess *)
                     AdsDevice::ReadReqEx2
                               (&this->device,*pvVar6 + 0x5000,7,2,&local_3ba,(uint32_t *)&status);
          if (local_30 != (ECatAccess *)0x0) {
            std::__cxx11::stringstream::stringstream(local_548);
            poVar3 = std::operator<<(local_538,"Reading type for device[");
            pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200
                                ,(ulong)local_3b8);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
            poVar3 = std::operator<<(poVar3,"] failed with 0x");
            pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
            std::ostream::operator<<(pvVar4,(long)local_30);
            std::__cxx11::stringstream::str();
            Logger::Log(3,(string *)(deviceName + 0xf8));
            std::__cxx11::string::~string((string *)(deviceName + 0xf8));
            std::__cxx11::stringstream::~stringstream(local_548);
            this_local = local_30;
            goto LAB_00173933;
          }
          deviceName[0xe8] = '\0';
          deviceName[0xe9] = '\0';
          deviceName[0xea] = '\0';
          deviceName[0xeb] = '\0';
          deviceName[0xec] = '\0';
          deviceName[0xed] = '\0';
          deviceName[0xee] = '\0';
          deviceName[0xef] = '\0';
          deviceName[0xf0] = '\0';
          deviceName[0xf1] = '\0';
          deviceName[0xf2] = '\0';
          deviceName[0xf3] = '\0';
          deviceName[0xf4] = '\0';
          deviceName[0xf5] = '\0';
          deviceName[0xf6] = '\0';
          deviceName[0xd8] = '\0';
          deviceName[0xd9] = '\0';
          deviceName[0xda] = '\0';
          deviceName[0xdb] = '\0';
          deviceName[0xdc] = '\0';
          deviceName[0xdd] = '\0';
          deviceName[0xde] = '\0';
          deviceName[0xdf] = '\0';
          deviceName[0xe0] = '\0';
          deviceName[0xe1] = '\0';
          deviceName[0xe2] = '\0';
          deviceName[0xe3] = '\0';
          deviceName[0xe4] = '\0';
          deviceName[0xe5] = '\0';
          deviceName[0xe6] = '\0';
          deviceName[0xe7] = '\0';
          deviceName[200] = '\0';
          deviceName[0xc9] = '\0';
          deviceName[0xca] = '\0';
          deviceName[0xcb] = '\0';
          deviceName[0xcc] = '\0';
          deviceName[0xcd] = '\0';
          deviceName[0xce] = '\0';
          deviceName[0xcf] = '\0';
          deviceName[0xd0] = '\0';
          deviceName[0xd1] = '\0';
          deviceName[0xd2] = '\0';
          deviceName[0xd3] = '\0';
          deviceName[0xd4] = '\0';
          deviceName[0xd5] = '\0';
          deviceName[0xd6] = '\0';
          deviceName[0xd7] = '\0';
          deviceName[0xb8] = '\0';
          deviceName[0xb9] = '\0';
          deviceName[0xba] = '\0';
          deviceName[0xbb] = '\0';
          deviceName[0xbc] = '\0';
          deviceName[0xbd] = '\0';
          deviceName[0xbe] = '\0';
          deviceName[0xbf] = '\0';
          deviceName[0xc0] = '\0';
          deviceName[0xc1] = '\0';
          deviceName[0xc2] = '\0';
          deviceName[0xc3] = '\0';
          deviceName[0xc4] = '\0';
          deviceName[0xc5] = '\0';
          deviceName[0xc6] = '\0';
          deviceName[199] = '\0';
          deviceName[0xa8] = '\0';
          deviceName[0xa9] = '\0';
          deviceName[0xaa] = '\0';
          deviceName[0xab] = '\0';
          deviceName[0xac] = '\0';
          deviceName[0xad] = '\0';
          deviceName[0xae] = '\0';
          deviceName[0xaf] = '\0';
          deviceName[0xb0] = '\0';
          deviceName[0xb1] = '\0';
          deviceName[0xb2] = '\0';
          deviceName[0xb3] = '\0';
          deviceName[0xb4] = '\0';
          deviceName[0xb5] = '\0';
          deviceName[0xb6] = '\0';
          deviceName[0xb7] = '\0';
          deviceName[0x98] = '\0';
          deviceName[0x99] = '\0';
          deviceName[0x9a] = '\0';
          deviceName[0x9b] = '\0';
          deviceName[0x9c] = '\0';
          deviceName[0x9d] = '\0';
          deviceName[0x9e] = '\0';
          deviceName[0x9f] = '\0';
          deviceName[0xa0] = '\0';
          deviceName[0xa1] = '\0';
          deviceName[0xa2] = '\0';
          deviceName[0xa3] = '\0';
          deviceName[0xa4] = '\0';
          deviceName[0xa5] = '\0';
          deviceName[0xa6] = '\0';
          deviceName[0xa7] = '\0';
          deviceName[0x88] = '\0';
          deviceName[0x89] = '\0';
          deviceName[0x8a] = '\0';
          deviceName[0x8b] = '\0';
          deviceName[0x8c] = '\0';
          deviceName[0x8d] = '\0';
          deviceName[0x8e] = '\0';
          deviceName[0x8f] = '\0';
          deviceName[0x90] = '\0';
          deviceName[0x91] = '\0';
          deviceName[0x92] = '\0';
          deviceName[0x93] = '\0';
          deviceName[0x94] = '\0';
          deviceName[0x95] = '\0';
          deviceName[0x96] = '\0';
          deviceName[0x97] = '\0';
          deviceName[0x78] = '\0';
          deviceName[0x79] = '\0';
          deviceName[0x7a] = '\0';
          deviceName[0x7b] = '\0';
          deviceName[0x7c] = '\0';
          deviceName[0x7d] = '\0';
          deviceName[0x7e] = '\0';
          deviceName[0x7f] = '\0';
          deviceName[0x80] = '\0';
          deviceName[0x81] = '\0';
          deviceName[0x82] = '\0';
          deviceName[0x83] = '\0';
          deviceName[0x84] = '\0';
          deviceName[0x85] = '\0';
          deviceName[0x86] = '\0';
          deviceName[0x87] = '\0';
          deviceName[0x68] = '\0';
          deviceName[0x69] = '\0';
          deviceName[0x6a] = '\0';
          deviceName[0x6b] = '\0';
          deviceName[0x6c] = '\0';
          deviceName[0x6d] = '\0';
          deviceName[0x6e] = '\0';
          deviceName[0x6f] = '\0';
          deviceName[0x70] = '\0';
          deviceName[0x71] = '\0';
          deviceName[0x72] = '\0';
          deviceName[0x73] = '\0';
          deviceName[0x74] = '\0';
          deviceName[0x75] = '\0';
          deviceName[0x76] = '\0';
          deviceName[0x77] = '\0';
          deviceName[0x58] = '\0';
          deviceName[0x59] = '\0';
          deviceName[0x5a] = '\0';
          deviceName[0x5b] = '\0';
          deviceName[0x5c] = '\0';
          deviceName[0x5d] = '\0';
          deviceName[0x5e] = '\0';
          deviceName[0x5f] = '\0';
          deviceName[0x60] = '\0';
          deviceName[0x61] = '\0';
          deviceName[0x62] = '\0';
          deviceName[99] = '\0';
          deviceName[100] = '\0';
          deviceName[0x65] = '\0';
          deviceName[0x66] = '\0';
          deviceName[0x67] = '\0';
          deviceName[0x48] = '\0';
          deviceName[0x49] = '\0';
          deviceName[0x4a] = '\0';
          deviceName[0x4b] = '\0';
          deviceName[0x4c] = '\0';
          deviceName[0x4d] = '\0';
          deviceName[0x4e] = '\0';
          deviceName[0x4f] = '\0';
          deviceName[0x50] = '\0';
          deviceName[0x51] = '\0';
          deviceName[0x52] = '\0';
          deviceName[0x53] = '\0';
          deviceName[0x54] = '\0';
          deviceName[0x55] = '\0';
          deviceName[0x56] = '\0';
          deviceName[0x57] = '\0';
          deviceName[0x38] = '\0';
          deviceName[0x39] = '\0';
          deviceName[0x3a] = '\0';
          deviceName[0x3b] = '\0';
          deviceName[0x3c] = '\0';
          deviceName[0x3d] = '\0';
          deviceName[0x3e] = '\0';
          deviceName[0x3f] = '\0';
          deviceName[0x40] = '\0';
          deviceName[0x41] = '\0';
          deviceName[0x42] = '\0';
          deviceName[0x43] = '\0';
          deviceName[0x44] = '\0';
          deviceName[0x45] = '\0';
          deviceName[0x46] = '\0';
          deviceName[0x47] = '\0';
          deviceName[0x28] = '\0';
          deviceName[0x29] = '\0';
          deviceName[0x2a] = '\0';
          deviceName[0x2b] = '\0';
          deviceName[0x2c] = '\0';
          deviceName[0x2d] = '\0';
          deviceName[0x2e] = '\0';
          deviceName[0x2f] = '\0';
          deviceName[0x30] = '\0';
          deviceName[0x31] = '\0';
          deviceName[0x32] = '\0';
          deviceName[0x33] = '\0';
          deviceName[0x34] = '\0';
          deviceName[0x35] = '\0';
          deviceName[0x36] = '\0';
          deviceName[0x37] = '\0';
          deviceName[0x18] = '\0';
          deviceName[0x19] = '\0';
          deviceName[0x1a] = '\0';
          deviceName[0x1b] = '\0';
          deviceName[0x1c] = '\0';
          deviceName[0x1d] = '\0';
          deviceName[0x1e] = '\0';
          deviceName[0x1f] = '\0';
          deviceName[0x20] = '\0';
          deviceName[0x21] = '\0';
          deviceName[0x22] = '\0';
          deviceName[0x23] = '\0';
          deviceName[0x24] = '\0';
          deviceName[0x25] = '\0';
          deviceName[0x26] = '\0';
          deviceName[0x27] = '\0';
          deviceName[8] = '\0';
          deviceName[9] = '\0';
          deviceName[10] = '\0';
          deviceName[0xb] = '\0';
          deviceName[0xc] = '\0';
          deviceName[0xd] = '\0';
          deviceName[0xe] = '\0';
          deviceName[0xf] = '\0';
          deviceName[0x10] = '\0';
          deviceName[0x11] = '\0';
          deviceName[0x12] = '\0';
          deviceName[0x13] = '\0';
          deviceName[0x14] = '\0';
          deviceName[0x15] = '\0';
          deviceName[0x16] = '\0';
          deviceName[0x17] = '\0';
          acStack_668[0] = '\0';
          acStack_668[1] = '\0';
          acStack_668[2] = '\0';
          acStack_668[3] = '\0';
          acStack_668[4] = '\0';
          acStack_668[5] = '\0';
          acStack_668[6] = '\0';
          acStack_668[7] = '\0';
          deviceName[0] = '\0';
          deviceName[1] = '\0';
          deviceName[2] = '\0';
          deviceName[3] = '\0';
          deviceName[4] = '\0';
          deviceName[5] = '\0';
          deviceName[6] = '\0';
          deviceName[7] = '\0';
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,
                              (ulong)local_3b8);
          local_30 = (ECatAccess *)
                     AdsDevice::ReadReqEx2
                               (&this->device,*pvVar6 + 0x5000,1,0xfe,acStack_668,
                                (uint32_t *)&status);
          if (local_30 != (ECatAccess *)0x0) {
            std::__cxx11::stringstream::stringstream(local_7f0);
            poVar3 = std::operator<<(local_7e0,"Reading name for device[");
            pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200
                                ,(ulong)local_3b8);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
            poVar3 = std::operator<<(poVar3,"] failed with 0x");
            pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
            std::ostream::operator<<(pvVar4,(long)local_30);
            std::__cxx11::stringstream::str();
            Logger::Log(3,local_810);
            std::__cxx11::string::~string((string *)local_810);
            std::__cxx11::stringstream::~stringstream(local_7f0);
            this_local = local_30;
            goto LAB_00173933;
          }
          AmsNetId::AmsNetId(&local_816,0);
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,
                              (ulong)local_3b8);
          local_30 = (ECatAccess *)
                     AdsDevice::ReadReqEx2
                               (&this->device,*pvVar6 + 0x5000,5,6,&local_816,(uint32_t *)&status);
          if (local_30 != (ECatAccess *)0x0) {
            std::__cxx11::stringstream::stringstream(local_9a0);
            poVar3 = std::operator<<(local_990,"Reading AmsNetId for device[");
            pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200
                                ,(ulong)local_3b8);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
            poVar3 = std::operator<<(poVar3,"] failed with 0x");
            pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
            std::ostream::operator<<(pvVar4,(long)local_30);
            std::__cxx11::stringstream::str();
            Logger::Log(3,local_9c0);
            std::__cxx11::string::~string((string *)local_9c0);
            std::__cxx11::stringstream::~stringstream(local_9a0);
            this_local = local_30;
            goto LAB_00173933;
          }
          uVar2 = CountECatSlaves(this,&local_816);
          poVar3 = _bytesRead;
          pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,
                              (ulong)local_3b8);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
          poVar3 = std::operator<<(poVar3," | ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3ba);
          poVar3 = std::operator<<(poVar3," | ");
          poVar3 = std::operator<<(poVar3,acStack_668);
          poVar3 = std::operator<<(poVar3," | ");
          poVar3 = ::operator<<(poVar3,&local_816);
          poVar3 = std::operator<<(poVar3," | ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
          std::operator<<(poVar3,'\n');
        }
        this_local = local_30;
      }
      else {
        std::__cxx11::stringstream::stringstream(local_390);
        poVar3 = std::operator<<(local_380,"Reading device ids failed with 0x");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
        std::ostream::operator<<(pvVar4,(long)local_30);
        std::__cxx11::stringstream::str();
        Logger::Log(3,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
        std::__cxx11::stringstream::~stringstream(local_390);
        this_local = local_30;
      }
LAB_00173933:
      uStack_3b4 = 1;
      local_30 = this_local;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,"Reading device count failed with 0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<(pvVar4,(long)local_30);
    std::__cxx11::stringstream::str();
    Logger::Log(3,(string *)
                  &deviceIds.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &deviceIds.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    this_local = local_30;
  }
  return (long)this_local;
}

Assistant:

long ECatAccess::ListECatMasters(std::ostream& os) const
{
    uint32_t numberOfDevices;
    uint32_t bytesRead;

    auto status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVCOUNT,
        sizeof(numberOfDevices), &numberOfDevices,
        &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device count failed with 0x" << std::hex << status);
        return status;
    }

    if (numberOfDevices == 0) {
        return status;
    }

    // the first element of the vector is set to devCount,
    // so the actual device Ids start at index 1
    std::vector<uint16_t> deviceIds(numberOfDevices + 1);

    status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVIDS,
        deviceIds.capacity() * sizeof(uint16_t),
        deviceIds.data(), &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device ids failed with 0x" << std::hex << status);
        return status;
    }

    // Skip the device count, which is at the first index
    for (uint32_t i = 1; i <= numberOfDevices; i++) {
        uint16_t devType;
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVTYPE,
            sizeof(devType),
            &devType,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading type for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        char deviceName[0xff] = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNAME,
            sizeof(deviceName) - 1,
            deviceName,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading name for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        AmsNetId netId = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNETID,
            sizeof(netId),
            &netId,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading AmsNetId for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        const auto slaveCount = CountECatSlaves(netId);
        os << deviceIds[i] << " | " << devType << " | " << deviceName << " | " << netId << " | " << slaveCount << '\n';
    }
    return status;
}